

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
libcellml::Variable::VariableImpl::setEquivalentConnectionId
          (VariableImpl *this,VariablePtr *equivalentVariable,string *id)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  mapped_type *this_00;
  undefined1 local_30 [8];
  VariableWeakPtr weakEquivalentVariable;
  string *id_local;
  VariablePtr *equivalentVariable_local;
  VariableImpl *this_local;
  
  weakEquivalentVariable.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)id;
  std::weak_ptr<libcellml::Variable>::weak_ptr<libcellml::Variable,void>
            ((weak_ptr<libcellml::Variable> *)local_30,equivalentVariable);
  _Var1._M_pi = weakEquivalentVariable.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this_00 = std::
            map<std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->mConnectionIdMap,(weak_ptr<libcellml::Variable> *)local_30);
  std::__cxx11::string::operator=((string *)this_00,(string *)_Var1._M_pi);
  std::weak_ptr<libcellml::Variable>::~weak_ptr((weak_ptr<libcellml::Variable> *)local_30);
  return;
}

Assistant:

void Variable::VariableImpl::setEquivalentConnectionId(const VariablePtr &equivalentVariable, const std::string &id)
{
    VariableWeakPtr weakEquivalentVariable = equivalentVariable;
    mConnectionIdMap[weakEquivalentVariable] = id;
}